

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *p,Vec_Int_t *vEquivs,Vec_Str_t *vStatus)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  iVar12 = vStatus->nSize;
  if (iVar12 * 2 != vEquivs->nSize) {
    __assert_fail("Vec_StrSize(vStatus) * 2 == Vec_IntSize(vEquivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x34b,"int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  if ((0 < p->nObjs) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    lVar9 = 0;
    do {
      if ((*(ulong *)(&p->pObjs->field_0x0 + lVar9) & 0x4000000000000000) != 0) {
        __assert_fail("pObj->fMark1 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                      ,0x34f,
                      "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)");
      }
      lVar9 = lVar9 + 0xc;
    } while ((ulong)(uint)p->nObjs * 0xc != lVar9);
  }
  uVar4 = 0;
  uVar6 = 0;
  if (0 < iVar12) {
    lVar9 = 0;
    uVar11 = 1;
    uVar6 = 0;
    do {
      if (((long)vEquivs->nSize <= (long)(uVar11 - 1)) || ((uint)vEquivs->nSize <= uVar11)) {
LAB_005adfb5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = vEquivs->pArray[uVar11];
      if (vEquivs->pArray[uVar11 - 1] != ((uint)p->pReprs[iVar7] & 0xfffffff)) {
        __assert_fail("iRepr == Gia_ObjRepr(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                      ,0x358,
                      "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)");
      }
      if (vStatus->pArray[lVar9] != '\x01') {
        if ((iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_005adf96:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        *(ulong *)(p->pObjs + iVar7) = *(ulong *)(p->pObjs + iVar7) | 0x4000000000000000;
        uVar6 = (ulong)((int)uVar6 + 1);
        iVar12 = vStatus->nSize;
      }
      lVar9 = lVar9 + 1;
      uVar11 = uVar11 + 2;
    } while (lVar9 < iVar12);
  }
  do {
    if (1 < p->nObjs) {
      lVar9 = 1;
      lVar10 = 0xc;
      do {
        pGVar3 = p->pObjs;
        uVar11 = *(ulong *)(&pGVar3->field_0x0 + lVar10);
        uVar5 = (uint)uVar11;
        if ((~uVar5 & 0x9fffffff) != 0) {
          iVar12 = (int)(uVar11 & 0x1fffffff);
          if ((int)uVar5 < 0 || (uVar11 & 0x1fffffff) == 0x1fffffff) {
            if ((-1 < (int)uVar5) || (iVar12 == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                            ,0x366,
                            "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)"
                           );
            }
            uVar13 = *(ulong *)((long)pGVar3 + lVar10 + (ulong)(uint)(iVar12 << 2) * -3);
          }
          else {
            uVar13 = *(ulong *)((long)pGVar3 +
                               lVar10 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3) |
                     *(ulong *)((long)pGVar3 + lVar10 + (ulong)(uint)(iVar12 << 2) * -3);
          }
          *(ulong *)(&pGVar3->field_0x0 + lVar10) = uVar13 & 0x4000000000000000 | uVar11;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar9 < p->nObjs);
    }
    iVar12 = p->nRegs;
    if (iVar12 < 1) goto LAB_005adf23;
    iVar7 = 0;
    iVar8 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar5 = (iVar1 - iVar12) + iVar8;
      if (((int)uVar5 < 0) || (iVar1 <= (int)uVar5)) goto LAB_005adfb5;
      iVar1 = p->vCos->pArray[uVar5];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005adf96;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      iVar2 = p->vCis->nSize;
      uVar5 = (iVar2 - iVar12) + iVar8;
      if (((int)uVar5 < 0) || (iVar2 <= (int)uVar5)) goto LAB_005adfb5;
      uVar5 = p->vCis->pArray[uVar5];
      lVar9 = (long)(int)uVar5;
      if ((lVar9 < 0) || ((uint)p->nObjs <= uVar5)) goto LAB_005adf96;
      iVar7 = iVar7 + (uint)(((*(ulong *)(pGVar3 + iVar1) ^ *(ulong *)(pGVar3 + lVar9)) >> 0x3e & 1)
                            != 0);
      *(ulong *)(pGVar3 + lVar9) =
           *(ulong *)(pGVar3 + lVar9) & 0xbfffffffffffffff |
           *(ulong *)(pGVar3 + iVar1) & 0x4000000000000000;
      iVar8 = iVar8 + 1;
      iVar12 = p->nRegs;
    } while (iVar8 < iVar12);
    if (iVar7 == 0) goto LAB_005adf23;
    uVar5 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar5;
  } while (uVar5 != 100);
  uVar4 = 100;
LAB_005adf23:
  if (p->nObjs < 1) {
    uVar11 = 0;
  }
  else {
    lVar9 = 0;
    lVar10 = 0;
    uVar11 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if ((*(ulong *)(&pGVar3->field_0x0 + lVar9) & 0x4000000000000000) != 0) {
        uVar11 = (ulong)(((int)uVar11 + 1) - (uint)((~(uint)p->pReprs[lVar10] & 0xfffffff) == 0));
      }
      *(ulong *)(&pGVar3->field_0x0 + lVar9) =
           *(ulong *)(&pGVar3->field_0x0 + lVar9) & 0xbfffffffffffffff;
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar10 < p->nObjs);
  }
  printf("%5d -> %5d (%3d)  ",uVar6,uVar11,uVar4);
  return 0;
}

Assistant:

int Cec_ManLSCorrAnalyzeDependence( Gia_Man_t * p, Vec_Int_t * vEquivs, Vec_Str_t * vStatus )
{
    Gia_Obj_t * pObj, * pObjRo;
    int i, Iter, iObj, iRepr, fPrev, Total, Count0, Count1;
    assert( Vec_StrSize(vStatus) * 2 == Vec_IntSize(vEquivs) );
    Total = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( pObj->fMark1 == 0 );
        if ( Gia_ObjHasRepr(p, i) )
            Total++;
    }
    Count0 = 0;
    for ( i = 0; i < Vec_StrSize(vStatus); i++ )
    {
        iRepr = Vec_IntEntry(vEquivs, 2*i);
        iObj = Vec_IntEntry(vEquivs, 2*i+1);
        assert( iRepr == Gia_ObjRepr(p, iObj) );
        if ( Vec_StrEntry(vStatus, i) != 1 ) // disproved or undecided
        {
            Gia_ManObj(p, iObj)->fMark1 = 1;
            Count0++;
        }
    }
    for ( Iter = 0; Iter < 100; Iter++ )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
//            fPrev = pObj->fMark1;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fMark1 |= Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else
                pObj->fMark1 |= Gia_ObjFanin0(pObj)->fMark1;
//            fChanges += fPrev ^ pObj->fMark1;
        }
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
        {
            fPrev = pObjRo->fMark1;
            pObjRo->fMark1 = pObj->fMark1;
            fChanges += fPrev ^ pObjRo->fMark1;
        }
        if ( fChanges == 0 )
            break;
    }
    Count1 = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( pObj->fMark1 && Gia_ObjHasRepr(p, i) )
            Count1++;
        pObj->fMark1 = 0;
    }
    printf( "%5d -> %5d (%3d)  ", Count0, Count1, Iter );
    return 0;
}